

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Response_NACK_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Minefield_Response_NACK_PDU::Encode
          (Minefield_Response_NACK_PDU *this,KDataStream *stream)

{
  KUOCTET *pKVar1;
  KUOCTET *pKVar2;
  
  Minefield_Header::Encode(&this->super_Minefield_Header,stream);
  (*(this->m_ReqID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_ReqID,stream);
  KDataStream::Write(stream,this->m_ui8ReqID);
  KDataStream::Write(stream,this->m_ui8NumMisPdus);
  pKVar1 = (this->m_vSeqNums).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pKVar2 = (this->m_vSeqNums).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_start; pKVar2 != pKVar1; pKVar2 = pKVar2 + 1) {
    KDataStream::Write(stream,*pKVar2);
  }
  return;
}

Assistant:

void Minefield_Response_NACK_PDU::Encode( KDataStream & stream ) const
{
    Minefield_Header::Encode( stream );

    stream << KDIS_STREAM m_ReqID
           << m_ui8ReqID
           << m_ui8NumMisPdus;

    vector<KUINT8>::const_iterator citr = m_vSeqNums.begin();
    vector<KUINT8>::const_iterator citrEnd = m_vSeqNums.end();
    for( ; citr != citrEnd; ++citr )
    {
        stream << *citr;
    }
}